

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_group.cpp
# Opt level: O2

void resize_group_parts(Am_Slot first_invalidated)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  Am_Value *pAVar9;
  Am_Object self;
  int local_60;
  int local_5c;
  Am_Value_List parts;
  Am_Object part;
  Am_Slot first_invalidated_local;
  
  self.data = (Am_Object_Data *)0x0;
  Am_Slot::Get_Owner((Am_Slot *)&parts);
  Am_Object::operator=(&self,(Am_Object *)&parts);
  Am_Object::~Am_Object((Am_Object *)&parts);
  poVar8 = std::operator<<((ostream *)&std::cout,"resize of ");
  poVar8 = operator<<(poVar8,&self);
  std::endl<char,std::char_traits<char>>(poVar8);
  std::ostream::flush();
  pAVar9 = Am_Object::Get(&self,0x7df,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar9);
  pAVar9 = Am_Object::Get(&self,0x7e0,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar9);
  pAVar9 = Am_Object::Get(&self,0x66,0);
  local_5c = Am_Value::operator_cast_to_int(pAVar9);
  pAVar9 = Am_Object::Get(&self,0x67,0);
  local_60 = Am_Value::operator_cast_to_int(pAVar9);
  if (iVar3 != 0 && iVar2 != 0) {
    local_5c = local_5c + (uint)(local_5c == 0);
    local_60 = local_60 + (uint)(local_60 == 0);
    Am_Value_List::Am_Value_List(&parts);
    pAVar9 = Am_Object::Get(&self,0x82,0);
    Am_Value_List::operator=(&parts,pAVar9);
    part.data = (Am_Object_Data *)0x0;
    Am_Value_List::Start(&parts);
    while( true ) {
      bVar1 = Am_Value_List::Last(&parts);
      if (bVar1) break;
      pAVar9 = Am_Value_List::Get(&parts);
      Am_Object::operator=(&part,pAVar9);
      pAVar9 = Am_Object::Get(&part,100,0);
      iVar4 = Am_Value::operator_cast_to_int(pAVar9);
      pAVar9 = Am_Object::Get(&part,0x65,0);
      iVar5 = Am_Value::operator_cast_to_int(pAVar9);
      pAVar9 = Am_Object::Get(&part,0x67,0);
      iVar6 = Am_Value::operator_cast_to_int(pAVar9);
      pAVar9 = Am_Object::Get(&part,0x66,0);
      iVar7 = Am_Value::operator_cast_to_int(pAVar9);
      Am_Object::Set(&part,100,(int)((float)iVar4 * ((float)local_5c / (float)iVar2)),0);
      Am_Object::Set(&part,0x66,(int)((float)iVar7 * ((float)local_5c / (float)iVar2)),0);
      Am_Object::Set(&part,0x65,(int)((float)iVar5 * ((float)local_60 / (float)iVar3)),0);
      Am_Object::Set(&part,0x67,(int)((float)iVar6 * ((float)local_60 / (float)iVar3)),0);
      Am_Value_List::Next(&parts);
    }
    Am_Object::~Am_Object(&part);
    Am_Value_List::~Am_Value_List(&parts);
  }
  Am_Object::Set(&self,0x7e0,local_60,0);
  Am_Object::Set(&self,0x7df,local_5c,0);
  Am_Object::~Am_Object(&self);
  return;
}

Assistant:

static void
resize_group_parts(Am_Slot first_invalidated)
{
  Am_Object self;
  self = first_invalidated.Get_Owner();
  std::cout << "resize of " << self << std::endl << std::flush;
  int old_width, old_height, new_width, new_height;
  float width_ratio, height_ratio;
  old_width = self.Get(Am_OLD_WIDTH);
  old_height = self.Get(Am_OLD_HEIGHT);
  new_width = self.Get(Am_WIDTH);
  new_height = self.Get(Am_HEIGHT);
  if (old_width && old_height) { //otherwise, first time changed
    if (new_width == 0)
      new_width = 1;
    if (new_height == 0)
      new_height = 1;
    width_ratio = (float)new_width / (float)old_width;
    height_ratio = (float)new_height / (float)old_height;
    Am_Value_List parts;
    parts = self.Get(Am_GRAPHICAL_PARTS);
    Am_Object part;
    for (parts.Start(); !parts.Last(); parts.Next()) {
      part = parts.Get();
      int left = (int)part.Get(Am_LEFT);
      int top = (int)part.Get(Am_TOP);
      int height = (int)part.Get(Am_HEIGHT);
      int width = (int)part.Get(Am_WIDTH);
      part.Set(Am_LEFT, (int)(left * width_ratio));
      part.Set(Am_WIDTH, (int)(width * width_ratio));
      part.Set(Am_TOP, (int)(top * height_ratio));
      part.Set(Am_HEIGHT, (int)(height * height_ratio));
    }
  }
  self.Set(Am_OLD_HEIGHT, new_height);
  self.Set(Am_OLD_WIDTH, new_width);
}